

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O3

void hook_quit(char *str)

{
  infofnt *piVar1;
  ang_file *f;
  term_data *t;
  infowin *p;
  wchar_t *pwVar2;
  long lVar3;
  infofnt *ifnt;
  ulong uVar4;
  
  f = file_open(settings,MODE_WRITE,FTYPE_TEXT);
  if (f != (ang_file *)0x0) {
    file_putf(f,"# %s X11 settings\n\n","FAangband");
    file_putf(f,"TERM_WINS=%d\n\n",(ulong)(uint)term_windows_open);
    pwVar2 = &data[0].tile_hgt;
    uVar4 = 0;
    do {
      if (*(_Bool *)((long)pwVar2 + -0xdd) == true) {
        file_putf(f,"# Term %d\n",uVar4 & 0xffffffff);
        file_putf(f,"AT_X_%d=%d\n",uVar4 & 0xffffffff,
                  (ulong)(uint)(int)(*(infowin **)(pwVar2 + -4))->x_save);
        file_putf(f,"AT_Y_%d=%d\n",uVar4 & 0xffffffff,
                  (ulong)(uint)(int)(*(infowin **)(pwVar2 + -4))->y_save);
        file_putf(f,"COLS_%d=%d\n",uVar4 & 0xffffffff,(ulong)(uint)pwVar2[-0x2e]);
        file_putf(f,"ROWS_%d=%d\n",uVar4 & 0xffffffff,(ulong)(uint)pwVar2[-0x2d]);
        file_putf(f,"IBOX_%d=%d\n",uVar4 & 0xffffffff,
                  (ulong)(uint)(int)(*(infowin **)(pwVar2 + -4))->ox);
        file_putf(f,"IBOY_%d=%d\n",uVar4 & 0xffffffff,
                  (ulong)(uint)(int)(*(infowin **)(pwVar2 + -4))->oy);
        file_putf(f,"FONT_%d=%s\n",uVar4 & 0xffffffff,(*(infofnt **)(pwVar2 + -6))->name);
        file_putf(f,"TILE_WIDTH_%d=%d\n",uVar4 & 0xffffffff,(ulong)(uint)pwVar2[-2]);
        file_putf(f,"TILE_HEIGHT_%d=%d\n",uVar4 & 0xffffffff,(ulong)(uint)*pwVar2);
        file_putf(f,"\n");
      }
      uVar4 = uVar4 + 1;
      pwVar2 = pwVar2 + 0x42;
    } while (uVar4 != 8);
    file_close(f);
  }
  if (L'\0' < term_windows_open) {
    t = data;
    lVar3 = 0;
    do {
      XFree(t->sizeh);
      XFree(t->classh);
      piVar1 = t->fnt;
      Infofnt = piVar1;
      if (piVar1->name != (char *)0x0) {
        string_free(piVar1->name);
      }
      if ((piVar1->field_0x19 & 2) != 0) {
        XFreeFontSet(metadpy_default_0,piVar1->fs);
      }
      mem_free(t->fnt);
      p = t->win;
      Infowin = p;
      if ((p->field_0x23 & 8) != 0) {
        XDestroyWindow(metadpy_default_0,p->win);
        p = t->win;
      }
      mem_free(p);
      term_nuke(&t->t);
      lVar3 = lVar3 + 1;
      t = t + 1;
    } while (lVar3 < term_windows_open);
  }
  Infoclr = xor;
  Infoclr_nuke();
  mem_free(xor);
  lVar3 = 0;
  do {
    Infoclr = *(infoclr **)((long)clr + lVar3);
    Infoclr_nuke();
    mem_free(*(void **)((long)clr + lVar3));
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x300);
  if ((metadpy_default_16 & 4) != 0) {
    XCloseDisplay(metadpy_default_0);
    metadpy_default_0 = 0;
    metadpy_default_16 = metadpy_default_16 & 0xfb;
  }
  return;
}

Assistant:

static void save_prefs(void)
{
	ang_file *fff;
	int i;

	/* Open the settings file */
	fff = file_open(settings, MODE_WRITE, FTYPE_TEXT);
	if (!fff) return;

	/* Header */
	file_putf(fff, "# %s X11 settings\n\n", VERSION_NAME);

	/* Number of term windows to open */
	file_putf(fff, "TERM_WINS=%d\n\n", term_windows_open);

	/* Save window prefs */
	for (i = 0; i < MAX_TERM_DATA; i++) {
		term_data *td = &data[i];

		if (!td->t.mapped_flag) continue;

		/* Header */
		file_putf(fff, "# Term %d\n", i);

		/*
		 * This doesn't seem to work under various WMs
		 * since the decoration messes the position up
		 *
		 * Hack -- Use saved window positions.
		 * This means that we won't remember ingame repositioned
		 * windows, but also means that WMs won't screw predefined
		 * positions up. -CJN-
		 */

		/* Window specific location (x) */
		file_putf(fff, "AT_X_%d=%d\n", i, td->win->x_save);

		/* Window specific location (y) */
		file_putf(fff, "AT_Y_%d=%d\n", i, td->win->y_save);

		/* Window specific cols */
		file_putf(fff, "COLS_%d=%d\n", i, td->t.wid);

		/* Window specific rows */
		file_putf(fff, "ROWS_%d=%d\n", i, td->t.hgt);

		/* Window specific inner border offset (ox) */
		file_putf(fff, "IBOX_%d=%d\n", i, td->win->ox);

		/* Window specific inner border offset (oy) */
		file_putf(fff, "IBOY_%d=%d\n", i, td->win->oy);

		/* Window specific font name */
		file_putf(fff, "FONT_%d=%s\n", i, td->fnt->name);

		/* Window specific tile width */
		file_putf(fff, "TILE_WIDTH_%d=%d\n", i, td->tile_wid);

		/* Window specific tile height */
		file_putf(fff, "TILE_HEIGHT_%d=%d\n", i, td->tile_hgt);

		/* Footer */
		file_putf(fff, "\n");
	}

	/* Close */
	file_close(fff);
}